

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O2

bool __thiscall
cmCTestMemCheckHandler::ProcessMemCheckOutput
          (cmCTestMemCheckHandler *this,string *str,string *log,
          vector<int,_std::allocator<int>_> *results)

{
  bool bVar1;
  
  switch(this->MemoryTesterStyle) {
  case 1:
    bVar1 = ProcessMemCheckValgrindOutput(this,str,log,results);
    return bVar1;
  case 2:
    bVar1 = ProcessMemCheckPurifyOutput(this,str,log,results);
    return bVar1;
  case 3:
    bVar1 = ProcessMemCheckBoundsCheckerOutput(this,str,log,results);
    return bVar1;
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
    bVar1 = ProcessMemCheckSanitizerOutput(this,str,log,results);
    return bVar1;
  default:
    std::__cxx11::string::append((char *)log);
    std::__cxx11::string::append((char *)log);
    std::__cxx11::string::_M_assign((string *)log);
    return true;
  }
}

Assistant:

bool cmCTestMemCheckHandler::ProcessMemCheckOutput(const std::string& str,
                                                   std::string& log,
                                                   std::vector<int>& results)
{
  switch (this->MemoryTesterStyle) {
    case cmCTestMemCheckHandler::VALGRIND:
      return this->ProcessMemCheckValgrindOutput(str, log, results);
    case cmCTestMemCheckHandler::PURIFY:
      return this->ProcessMemCheckPurifyOutput(str, log, results);
    case cmCTestMemCheckHandler::ADDRESS_SANITIZER:
    case cmCTestMemCheckHandler::LEAK_SANITIZER:
    case cmCTestMemCheckHandler::THREAD_SANITIZER:
    case cmCTestMemCheckHandler::MEMORY_SANITIZER:
    case cmCTestMemCheckHandler::UB_SANITIZER:
      return this->ProcessMemCheckSanitizerOutput(str, log, results);
    case cmCTestMemCheckHandler::BOUNDS_CHECKER:
      return this->ProcessMemCheckBoundsCheckerOutput(str, log, results);
    default:
      log.append("\nMemory checking style used was: ");
      log.append("None that I know");
      log = str;
      return true;
  }
}